

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamDataDownloadBuffer
          (QNetworkReplyImplPrivate *this,qint64 bytesReceived,qint64 bytesTotal)

{
  QNetworkReply *this_00;
  long lVar1;
  char cVar2;
  
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  cVar2 = QIODevice::isOpen();
  if (cVar2 != '\0') {
    if ((this->cacheEnabled == true) && (this->cacheSaveDevice == (QIODevice *)0x0)) {
      initCacheSaveDevice(this);
    }
    if (bytesReceived == bytesTotal && this->cacheSaveDevice != (QIODevice *)0x0) {
      QIODevice::write((char *)this->cacheSaveDevice,(longlong)this->downloadBuffer);
    }
    this->bytesDownloaded = bytesReceived;
    this->downloadBufferCurrentSize = bytesReceived;
    if (0 < bytesReceived) {
      QIODevice::readyRead();
    }
    cVar2 = QElapsedTimer::isValid();
    if (cVar2 != '\0') {
      lVar1 = QElapsedTimer::elapsed();
      if (99 < lVar1) {
        QElapsedTimer::start();
        QNetworkReply::downloadProgress(this_00,this->bytesDownloaded,bytesTotal);
        return;
      }
    }
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamDataDownloadBuffer(qint64 bytesReceived, qint64 bytesTotal)
{
    Q_Q(QNetworkReplyImpl);
    if (!q->isOpen())
        return;

    if (cacheEnabled && !cacheSaveDevice)
        initCacheSaveDevice();

    if (cacheSaveDevice && bytesReceived == bytesTotal) {
        // Write everything in one go if we use a download buffer. might be more performant.
        cacheSaveDevice->write(downloadBuffer, bytesTotal);
    }

    bytesDownloaded = bytesReceived;

    downloadBufferCurrentSize = bytesReceived;

    // Only emit readyRead when actual data is there
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (bytesDownloaded > 0)
        emit q->readyRead();
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, bytesTotal);
    }
}